

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_part_cell_node(REF_CELL ref_cell,REF_NODE ref_node,REF_INT cell,REF_INT *cell_node)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  REF_STATUS RVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  *cell_node = -1;
  RVar4 = 3;
  if ((-1 < cell) && (cell <= ref_cell->max)) {
    lVar7 = (long)cell * (long)ref_cell->size_per;
    uVar1 = ref_cell->c2n[lVar7];
    if ((ulong)uVar1 != 0xffffffff) {
      lVar3 = -1;
      lVar5 = lVar3;
      if ((-1 < (int)uVar1) && ((int)uVar1 < ref_node->max)) {
        lVar5 = -1;
        if (-1 < ref_node->global[uVar1]) {
          lVar5 = ref_node->global[uVar1];
        }
      }
      uVar6 = 0;
      for (uVar8 = 1; (long)uVar8 < (long)ref_cell->node_per; uVar8 = uVar8 + 1) {
        iVar2 = ref_cell->c2n[lVar7 + uVar8];
        lVar9 = lVar3;
        if (((-1 < (long)iVar2) && (iVar2 < ref_node->max)) &&
           (lVar9 = ref_node->global[iVar2], ref_node->global[iVar2] < 0)) {
          lVar9 = lVar3;
        }
        if (lVar9 < lVar5) {
          uVar6 = uVar8 & 0xffffffff;
          lVar5 = lVar9;
        }
      }
      if ((int)uVar6 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x38a,"ref_cell_part_cell_node","node is empty?");
        RVar4 = 1;
      }
      else {
        *cell_node = (int)uVar6;
        RVar4 = 0;
      }
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_part_cell_node(REF_CELL ref_cell, REF_NODE ref_node,
                                           REF_INT cell, REF_INT *cell_node) {
  REF_GLOB global, smallest_global;
  REF_INT node, smallest_global_node;
  *cell_node = REF_EMPTY;
  if (cell < 0 || cell > ref_cell_max(ref_cell)) return REF_INVALID;
  if (REF_EMPTY == ref_cell_c2n(ref_cell, 0, cell)) return REF_INVALID;
  /* set first node as smallest */
  node = 0;
  global = ref_node_global(ref_node, ref_cell_c2n(ref_cell, node, cell));
  smallest_global = global;
  smallest_global_node = node;
  /* search other nodes for smaller global */
  for (node = 1; node < ref_cell_node_per(ref_cell); node++) {
    global = ref_node_global(ref_node, ref_cell_c2n(ref_cell, node, cell));
    if (global < smallest_global) {
      smallest_global = global;
      smallest_global_node = node;
    }
  }
  RUS(REF_EMPTY, smallest_global_node, "node is empty?");
  *cell_node = smallest_global_node;
  return REF_SUCCESS;
}